

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O0

bool __thiscall
duckdb::QuantileCompare<duckdb::MadAccessor<long,_long,_long>_>::operator()
          (QuantileCompare<duckdb::MadAccessor<long,_long,_long>_> *this,INPUT_TYPE *lhs,
          INPUT_TYPE *rhs)

{
  MadAccessor<long,_long,_long> *this_00;
  RESULT_TYPE_conflict2 RVar1;
  long in_RDI;
  RESULT_TYPE_conflict2 rval;
  RESULT_TYPE_conflict2 lval;
  undefined1 local_31;
  INPUT_TYPE_conflict2 *in_stack_ffffffffffffffd8;
  MadAccessor<long,_long,_long> *in_stack_ffffffffffffffe0;
  
  this_00 = (MadAccessor<long,_long,_long> *)
            MadAccessor<long,_long,_long>::operator()
                      (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  RVar1 = MadAccessor<long,_long,_long>::operator()(this_00,in_stack_ffffffffffffffd8);
  if ((*(byte *)(in_RDI + 0x10) & 1) == 0) {
    local_31 = (long)this_00 < RVar1;
  }
  else {
    local_31 = RVar1 < (long)this_00;
  }
  return local_31;
}

Assistant:

inline bool operator()(const INPUT_TYPE &lhs, const INPUT_TYPE &rhs) const {
		const auto lval = accessor_l(lhs);
		const auto rval = accessor_r(rhs);

		return desc ? (rval < lval) : (lval < rval);
	}